

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

void showFeedback(void)

{
  if ("-\\|/"[ta_g_val] == '\0') {
    ta_g_val = 0;
  }
  putchar(8);
  putchar((int)"-\\|/"[ta_g_val]);
  fflush(_stdout);
  ta_g_val = ta_g_val + 1;
  return;
}

Assistant:

void showFeedback()
{
   if( ta_g_wheel[ta_g_val] == '\0' )
      ta_g_val = 0;
   putchar('\b');
   putchar(ta_g_wheel[ta_g_val]);
   fflush(stdout);
   ta_g_val++;
}